

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::initialiseLpRowCost(HEkk *this)

{
  reference pvVar1;
  long in_RDI;
  HighsInt iCol;
  undefined4 local_c;
  
  for (local_c = *(int *)(in_RDI + 0x2198);
      local_c < *(int *)(in_RDI + 0x2198) + *(int *)(in_RDI + 0x219c); local_c = local_c + 1) {
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2560),(long)local_c);
    *pvVar1 = 0.0;
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x2590),(long)local_c);
    *pvVar1 = 0.0;
  }
  return;
}

Assistant:

void HEkk::initialiseLpRowCost() {
  for (HighsInt iCol = lp_.num_col_; iCol < lp_.num_col_ + lp_.num_row_;
       iCol++) {
    info_.workCost_[iCol] = 0;
    info_.workShift_[iCol] = 0;
  }
}